

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-parser.cc
# Opt level: O0

void __thiscall GenParser::visit(GenParser *this,Or *node)

{
  Temp *target_00;
  string local_48;
  Temp *local_28;
  Temp *target;
  BasicBlock *iffalse;
  Or *node_local;
  GenParser *this_local;
  
  iffalse = (BasicBlock *)node;
  node_local = (Or *)this;
  target = (Temp *)IR::IRBuilder::newBasicBlock(&this->super_IRBuilder);
  std::__cxx11::string::string((string *)&local_48);
  target_00 = IR::IRBuilder::newTemp(&this->super_IRBuilder,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_28 = target_00;
  IR::IRBuilder::save(&this->super_IRBuilder,target_00);
  CodeGenerator::condition
            (&this->super_CodeGenerator,
             (Node *)(iffalse->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
                     super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,(this->super_CodeGenerator).code.iftrue,
             (BasicBlock *)target);
  IR::IRBuilder::place(&this->super_IRBuilder,(BasicBlock *)target);
  IR::IRBuilder::restore(&this->super_IRBuilder,local_28);
  CodeGenerator::condition
            (&this->super_CodeGenerator,
             (Node *)(iffalse->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
                     super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
             (this->super_CodeGenerator).code.iftrue,(this->super_CodeGenerator).code.iffalse);
  return;
}

Assistant:

void GenParser::visit(ast::Or* node) {
  auto iffalse = newBasicBlock();
  auto target = newTemp();

  save(target);
  condition(node->head, code.iftrue, iffalse);
  place(iffalse);
  restore(target);
  condition(node->tail, code.iftrue, code.iffalse);
}